

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O1

MTBDDMAP mtbdd_map_add(MTBDDMAP map,uint32_t key,MTBDD value)

{
  uint8_t *puVar1;
  ulong uVar2;
  uint uVar3;
  MTBDD MVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  
  if (map == 0) {
    map = 0;
  }
  else {
    puVar1 = nodes->data;
    lVar6 = (map & 0xffffffffff) * 0x10;
    uVar2 = *(ulong *)(puVar1 + lVar6 + 8);
    uVar3 = (uint)(uVar2 >> 0x20);
    uVar7 = uVar3 >> 8;
    if (uVar7 < key) {
      uVar5 = map & 0x8000000000000000;
      map = mtbdd_map_add(uVar2 & 0xffffffffff | uVar5,key,value);
      value = *(ulong *)(puVar1 + lVar6) & 0x800000ffffffffff ^ uVar5;
      key = uVar3 >> 8;
    }
    else if (uVar7 <= key) {
      map = map & 0x8000000000000000 | uVar2 & 0xffffffffff;
    }
  }
  MVar4 = mtbdd_makemapnode(key,map,value);
  return MVar4;
}

Assistant:

MTBDDMAP
mtbdd_map_add(MTBDDMAP map, uint32_t key, MTBDD value)
{
    if (mtbdd_map_isempty(map)) {
        return mtbdd_makemapnode(key, mtbdd_map_empty(), value);
    }

    mtbddnode_t n = MTBDD_GETNODE(map);
    uint32_t k = mtbddnode_getvariable(n);

    if (k < key) {
        // add recursively and rebuild tree
        MTBDDMAP low = mtbdd_map_add(node_getlow(map, n), key, value);
        return mtbdd_makemapnode(k, low, node_gethigh(map, n));
    } else if (k > key) {
        return mtbdd_makemapnode(key, map, value);
    } else {
        // replace old
        return mtbdd_makemapnode(key, node_getlow(map, n), value);
    }
}